

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CDict * ZSTD_createCDict(void *dict,size_t dictSize,int compressionLevel)

{
  ZSTD_customMem customMem;
  ZSTD_CDict *pZVar1;
  int iVar2;
  ZSTD_compressionParameters local_f8;
  ZSTD_CCtx_params local_d8;
  
  ZSTD_getCParams_internal
            (&local_f8,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
  memset(&local_d8,0,0x98);
  local_d8.fParams.contentSizeFlag = 1;
  local_d8.cParams.windowLog = local_f8.windowLog;
  local_d8.cParams.chainLog = local_f8.chainLog;
  local_d8.cParams.targetLength = local_f8.targetLength;
  local_d8.cParams.strategy = local_f8.strategy;
  local_d8.customMem.customAlloc = (ZSTD_allocFunction)0x0;
  local_d8.customMem.customFree = (ZSTD_freeFunction)0x0;
  local_d8.customMem.opaque = (void *)0x0;
  customMem.opaque = (void *)0x0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  pZVar1 = ZSTD_createCDict_advanced2
                     (dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto,&local_d8,customMem);
  if (pZVar1 != (ZSTD_CDict *)0x0) {
    iVar2 = 3;
    if (compressionLevel != 0) {
      iVar2 = compressionLevel;
    }
    pZVar1->compressionLevel = iVar2;
  }
  return pZVar1;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict(const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    ZSTD_CDict* const cdict = ZSTD_createCDict_advanced(dict, dictSize,
                                                  ZSTD_dlm_byCopy, ZSTD_dct_auto,
                                                  cParams, ZSTD_defaultCMem);
    if (cdict)
        cdict->compressionLevel = (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : compressionLevel;
    return cdict;
}